

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_data.cpp
# Opt level: O0

void __thiscall
ximu::DateTimeData::DateTimeData
          (DateTimeData *this,size_t year,size_t month,size_t day,size_t hours,size_t minutes,
          size_t seconds)

{
  size_t minutes_local;
  size_t hours_local;
  size_t day_local;
  size_t month_local;
  size_t year_local;
  DateTimeData *this_local;
  
  this->_year = year;
  this->_month = month;
  this->_day = day;
  this->_hours = hours;
  this->_minutes = minutes;
  this->_seconds = seconds;
  return;
}

Assistant:

DateTimeData::DateTimeData(size_t year, size_t month, size_t day,
               size_t hours, size_t minutes, size_t seconds)
    :
    _year(year),
    _month(month),
    _day(day),
    _hours(hours),
    _minutes(minutes),
    _seconds(seconds) {
}